

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

vector<llvm::DILocal,_std::allocator<llvm::DILocal>_> * __thiscall
llvm::DWARFContext::getLocalsForAddress
          (vector<llvm::DILocal,_std::allocator<llvm::DILocal>_> *__return_storage_ptr__,
          DWARFContext *this,SectionedAddress Address)

{
  DWARFUnit *this_00;
  DWARFDie Subprogram;
  
  (__return_storage_ptr__->super__Vector_base<llvm::DILocal,_std::allocator<llvm::DILocal>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::DILocal,_std::allocator<llvm::DILocal>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::DILocal,_std::allocator<llvm::DILocal>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &getCompileUnitForAddress(this,Address.Address)->super_DWARFUnit;
  if (this_00 != (DWARFUnit *)0x0) {
    Subprogram = DWARFUnit::getSubroutineForAddress(this_00,Address.Address);
    if (Subprogram.Die != (DWARFDebugInfoEntry *)0x0 && Subprogram.U != (DWARFUnit *)0x0) {
      addLocalsForDie(this,(DWARFCompileUnit *)this_00,Subprogram,Subprogram,__return_storage_ptr__)
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<DILocal>
DWARFContext::getLocalsForAddress(object::SectionedAddress Address) {
  std::vector<DILocal> Result;
  DWARFCompileUnit *CU = getCompileUnitForAddress(Address.Address);
  if (!CU)
    return Result;

  DWARFDie Subprogram = CU->getSubroutineForAddress(Address.Address);
  if (Subprogram.isValid())
    addLocalsForDie(CU, Subprogram, Subprogram, Result);
  return Result;
}